

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_643cf::DirectoryInputNodeTask::provideValue
          (DirectoryInputNodeTask *this,TaskInterface ti,uintptr_t inputID,KeyType *key,
          ValueType *valueData)

{
  int iVar1;
  BuildValue value;
  BuildValue BStack_88;
  
  if (inputID != 0) {
    llbuild::buildsystem::BuildValue::fromData(&BStack_88,valueData);
    iVar1 = this->finishedBlockingDeps + 1;
    this->finishedBlockingDeps = iVar1;
    if (iVar1 == this->totalBlockingDeps) {
      performUnblockedRequest(this,ti);
    }
    llbuild::buildsystem::BuildValue::~BuildValue(&BStack_88);
    return;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (&this->directorySignature,valueData);
  return;
}

Assistant:

virtual void provideValue(TaskInterface ti, uintptr_t inputID,
                            const KeyType& key, const ValueType& valueData) override {
    if (inputID == 0) {
      directorySignature = valueData;
    } else {
      auto value = BuildValue::fromData(valueData);

      ++finishedBlockingDeps;
      if (finishedBlockingDeps == totalBlockingDeps) {
        // All paths within mustScanAfterPaths are scanned..
        // DirectoryTreeSignature is unblocked
        performUnblockedRequest(ti);
      }
    }
  }